

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

_Bool hash_table_add_to_table
                (hash_table *p_hash_table,uint32_t hash_value,block_hash *curr_block_hash)

{
  int iVar1;
  void *pvVar2;
  size_t in_RDX;
  uint in_ESI;
  long *in_RDI;
  Vector *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(long *)(*in_RDI + (ulong)in_ESI * 8) == 0) {
    pvVar2 = aom_malloc(0x264743);
    *(void **)(*in_RDI + (ulong)in_ESI * 8) = pvVar2;
    if (*(long *)(*in_RDI + (ulong)in_ESI * 8) == 0) {
      return false;
    }
    iVar1 = aom_vector_setup((Vector *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                             (size_t)in_stack_ffffffffffffffd8);
    if (iVar1 == -1) {
      return false;
    }
    iVar1 = aom_vector_push_back(in_stack_ffffffffffffffd8,(void *)0x2647b8);
    if (iVar1 == -1) {
      return false;
    }
  }
  else {
    iVar1 = aom_vector_push_back(in_stack_ffffffffffffffd8,(void *)0x2647e0);
    if (iVar1 == -1) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool hash_table_add_to_table(hash_table *p_hash_table,
                                    uint32_t hash_value,
                                    block_hash *curr_block_hash) {
  if (p_hash_table->p_lookup_table[hash_value] == NULL) {
    p_hash_table->p_lookup_table[hash_value] =
        aom_malloc(sizeof(p_hash_table->p_lookup_table[0][0]));
    if (p_hash_table->p_lookup_table[hash_value] == NULL) {
      return false;
    }
    if (aom_vector_setup(p_hash_table->p_lookup_table[hash_value], 10,
                         sizeof(curr_block_hash[0])) == VECTOR_ERROR)
      return false;
    if (aom_vector_push_back(p_hash_table->p_lookup_table[hash_value],
                             curr_block_hash) == VECTOR_ERROR)
      return false;
  } else {
    if (aom_vector_push_back(p_hash_table->p_lookup_table[hash_value],
                             curr_block_hash) == VECTOR_ERROR)
      return false;
  }
  return true;
}